

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result wabt::ReadBinaryIr(char *filename,void *data,size_t size,ReadBinaryOptions *options,
                         Errors *errors,Module *out_module)

{
  Result RVar1;
  undefined1 local_e8 [8];
  BinaryReaderIR reader;
  Module *out_module_local;
  Errors *errors_local;
  ReadBinaryOptions *options_local;
  size_t size_local;
  void *data_local;
  char *filename_local;
  
  reader.current_metadata_name_._M_str = (char *)out_module;
  anon_unknown_15::BinaryReaderIR::BinaryReaderIR
            ((BinaryReaderIR *)local_e8,out_module,filename,errors);
  RVar1 = ReadBinary(data,size,(BinaryReaderDelegate *)local_e8,options);
  anon_unknown_15::BinaryReaderIR::~BinaryReaderIR((BinaryReaderIR *)local_e8);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryIr(const char* filename,
                    const void* data,
                    size_t size,
                    const ReadBinaryOptions& options,
                    Errors* errors,
                    Module* out_module) {
  BinaryReaderIR reader(out_module, filename, errors);
  return ReadBinary(data, size, &reader, options);
}